

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  char **ppcVar1;
  undefined4 in_EAX;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_type __n;
  size_t sVar4;
  long *plVar5;
  undefined8 uVar6;
  long *plVar7;
  long *__s;
  undefined1 auVar8 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator local_79;
  char **local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  auVar8._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar8._4_4_ = -(uint)(num_headers == (int *)0x0);
  auVar8._8_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  auVar8._12_4_ = -(uint)(filename == (char *)0x0);
  iVar2 = movmskps(in_EAX,auVar8);
  if (iVar2 == 0) {
    local_78 = err;
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::string::string((string *)&local_70,filename,&local_79);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2552f9);
      ppcVar1 = local_78;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_40 = *plVar7;
        lStack_38 = plVar5[3];
        __s = &local_40;
      }
      else {
        local_40 = *plVar7;
        __s = (long *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_50 = __s;
      if (local_78 != (char **)0x0) {
        pcVar3 = strdup((char *)__s);
        *ppcVar1 = pcVar3;
      }
      if (__s != &local_40) {
        operator_delete(__s);
      }
      if ((pointer *)
          local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar2 = -7;
    }
    else {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_70,__n,(allocator_type *)&local_50);
      sVar4 = fread(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (sVar4 == __n) {
        if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar6 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_70.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar6);
        }
        iVar2 = ParseEXRMultipartHeaderFromMemory
                          (exr_headers,num_headers,exr_version,
                           local_70.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,__n,local_78);
      }
      else {
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"`fread\' error. file may be corrupted.","");
        plVar5 = local_50;
        ppcVar1 = local_78;
        if (local_78 != (char **)0x0) {
          pcVar3 = strdup((char *)local_50);
          *ppcVar1 = pcVar3;
        }
        if (plVar5 != &local_40) {
          operator_delete(plVar5);
        }
        iVar2 = -5;
      }
      if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Invalid argument for ParseEXRMultipartHeaderFromFile()","");
    plVar5 = local_50;
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_50);
      *err = pcVar3;
    }
    if (plVar5 != &local_40) {
      operator_delete(plVar5);
    }
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromFile()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_INVALID_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      tinyexr::SetErrorMessage("`fread' error. file may be corrupted.", err);
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRMultipartHeaderFromMemory(
      exr_headers, num_headers, exr_version, &buf.at(0), filesize, err);
}